

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::~WatWriter(WatWriter *this)

{
  vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *local_18;
  WatWriter *this_local;
  
  local_18 = (vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *)
             &this->func_index_;
  do {
    local_18 = local_18 + -1;
    std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::~vector(local_18);
  } while (local_18 != this->inline_import_map_);
  std::
  multimap<std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*,_std::less<std::pair<wabt::ExternalKind,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  ::~multimap(&this->inline_export_map_);
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::~vector(&this->expr_tree_stack_);
  std::
  vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>::
  ~vector(&this->label_stack_);
  return;
}

Assistant:

WatWriter(Stream* stream, const WriteWatOptions& options)
      : options_(options), stream_(stream) {}